

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O1

void __thiscall
DemoScripts::TrainSpikingIris(DemoScripts *this,char *path,default_random_engine *generator)

{
  pointer ppIVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  IDenseNetwork *pIVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  initializer_list<LayerMeta> __l;
  vector<float,_std::allocator<float>_> output;
  vector<float,_std::allocator<float>_> deltas;
  SpikeTrainDataset data;
  DenseLifLayerBuilder layerBuilder;
  LifNeuronBuilder neuronBuilder;
  vector<LayerMeta,_std::allocator<LayerMeta>_> layersMeta;
  Dataset rawData;
  LifSynapseBuilder synapseBuilder;
  PreciseEventManager eventManager;
  float local_298;
  float local_294;
  double local_290;
  double local_288;
  int local_27c;
  string local_278;
  double local_258;
  ulong local_250;
  float local_244;
  int local_240;
  int local_23c;
  vector<float,_std::allocator<float>_> local_238;
  IDenseNetwork *local_220;
  SpikeTrainDataset local_218;
  ulong local_1b0;
  vector<INeuron_*,_std::allocator<INeuron_*>_> local_1a8;
  undefined **local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [8];
  _Alloc_hider _Stack_160;
  pointer local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_150;
  pointer pfStack_140;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_138;
  pointer *ppfStack_120;
  pointer local_118;
  pointer apfStack_110 [2];
  undefined8 local_100;
  pointer local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  long *local_e0 [2];
  long local_d0 [2];
  undefined8 local_c0;
  pointer local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  LifSynapseBuilder local_78 [16];
  code *local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>_>
  local_60 [48];
  
  LifSynapseBuilder::LifSynapseBuilder(local_78,(linear_congruential_engine *)generator);
  local_188._0_8_ = __gmon_start__;
  local_190 = &PTR_Build_00116cf8;
  PreciseEventManager::PreciseEventManager((PreciseEventManager *)&local_68);
  local_168._0_4_ = 1.0;
  _Stack_160._M_p = (pointer)&aStack_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_160,"input","");
  pfStack_140 = (pointer)0x4;
  local_138.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f800000;
  local_138.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_138.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3f800000);
  ppfStack_120 = apfStack_110;
  local_138.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ppfStack_120,"hidden2","");
  local_100 = 6;
  local_f0 = 0x3f80000040000000;
  local_e8 = 0x3f000000;
  plVar9 = local_d0;
  local_f8 = (pointer)local_188;
  local_e0[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"output","");
  local_c0 = 3;
  local_b0 = 0x3f8000003f000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_168;
  local_b8 = (pointer)local_188;
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::vector
            ((vector<LayerMeta,_std::allocator<LayerMeta>_> *)(local_188 + 8),__l,
             (allocator_type *)&local_218);
  lVar14 = -0xc0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -8;
    lVar14 = lVar14 + 0x40;
  } while (lVar14 != 0);
  pIVar5 = IDenseNetworkBuilder::Build
                     ((IDenseNetworkBuilder *)local_168,
                      (vector<LayerMeta,_std::allocator<LayerMeta>_> *)(local_188 + 8),
                      (ISynapseBuilder *)local_78,(ILayerBuilder *)&local_190,
                      (IEventManager *)&local_68,generator,0.0);
  local_118 = (pointer)0x0;
  apfStack_110[0] = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppfStack_120 = (pointer *)0x0;
  local_138.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aStack_150._8_8_ = 0;
  pfStack_140 = (pointer)0x0;
  local_158 = (pointer)0x0;
  aStack_150._M_allocated_capacity = 0;
  local_168 = (undefined1  [8])0x0;
  _Stack_160._M_p = (pointer)0x0;
  local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.xTest.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_218.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_218.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.xTrain.
  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_278,path,(allocator *)&local_238);
  IRIS::ReadIris((string *)&local_278,(Dataset *)local_168,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  DATA_CONVERSION::ConvertDataToSpikeTrains
            ((Dataset *)local_168,&local_218,(linear_congruential_engine *)generator,200.0);
  local_250 = 0;
  local_220 = pIVar5;
  do {
    if (local_218.xTrain.
        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_218.xTrain.
        super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_290 = 0.0;
      iVar15 = 0;
      local_298 = 0.0;
      iVar13 = 0;
      local_27c = 0;
      iVar3 = 0;
      local_288 = 0.0;
      local_258 = 0.0;
      local_294 = 0.0;
    }
    else {
      uVar10 = 0;
      fVar16 = 0.0;
      local_294 = 0.0;
      fVar19 = 0.0;
      fVar18 = 0.0;
      iVar3 = 0;
      local_27c = 0;
      iVar13 = 0;
      iVar11 = 0;
      iVar15 = 0;
      do {
        local_258 = (double)CONCAT44(local_258._4_4_,fVar16);
        IDenseNetwork::Forward
                  ((vector<float,_std::allocator<float>_> *)&local_278,pIVar5,
                   local_218.xTrain.
                   super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar10,200.0,false);
        local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        IDenseNetwork::GetOutputNeurons(&local_1a8,pIVar5);
        local_244 = NormedCustomLoss2(&local_1a8,
                                      local_218.yTrain.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar10],&local_238);
        if (local_1a8.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1a8.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar5 = local_220;
        fVar16 = *(float *)local_278._M_dataplus._M_p;
        uVar8 = (long)(local_278._M_string_length - (long)local_278._M_dataplus._M_p) >> 2;
        iVar2 = 0;
        if (1 < uVar8) {
          uVar12 = 1;
          uVar6 = 0;
          fVar17 = fVar16;
          do {
            fVar16 = *(float *)(local_278._M_dataplus._M_p + uVar12 * 4);
            if (fVar17 < fVar16) {
              uVar6 = uVar12;
            }
            iVar2 = (int)uVar6;
            if (fVar16 <= fVar17) {
              fVar16 = fVar17;
            }
            uVar12 = uVar12 + 1;
            fVar17 = fVar16;
          } while (uVar8 != uVar12);
        }
        if (fVar16 <= 0.0) {
          iVar2 = -1;
        }
        iVar13 = iVar13 + (uint)(iVar2 == 0);
        fVar16 = local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10];
        local_a8 = ZEXT416((uint)*local_238.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        local_98 = ZEXT416((uint)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[1]);
        local_88 = ZEXT416((uint)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[2]);
        local_240 = iVar3;
        local_23c = iVar15;
        local_1b0 = uVar10;
        IDenseNetwork::Backward(local_220,&local_238);
        IDenseNetwork::GradStep(pIVar5,1,1e-06,1e-05,10.0,0.0001);
        IDenseNetwork::Reset(pIVar5);
        if (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._M_dataplus._M_p,
                          local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p
                         );
        }
        local_294 = local_294 + local_244;
        iVar15 = local_23c + (uint)(iVar2 == -1);
        local_27c = local_27c + (uint)(iVar2 == 1);
        iVar3 = local_240 + (uint)(iVar2 == 2);
        iVar11 = iVar11 + (uint)(ABS((float)iVar2 - fVar16) < 0.1);
        fVar18 = fVar18 + ABS((float)local_a8._0_4_);
        fVar19 = fVar19 + ABS((float)local_98._0_4_);
        fVar16 = local_258._0_4_ + ABS((float)local_88._0_4_);
        uVar10 = local_1b0 + 1;
        uVar8 = ((long)local_218.xTrain.
                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_218.xTrain.
                       super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        pIVar5 = local_220;
      } while (uVar10 <= uVar8 && uVar8 - uVar10 != 0);
      local_290 = (double)fVar18;
      local_288 = (double)fVar19;
      local_258 = (double)fVar16;
      local_298 = (float)iVar11;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Loss for epoch: ",0x10);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," is: ",5);
    lVar14 = std::cout;
    *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                  *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(&PreciseEventManager::vtable + *(long *)(lVar14 + -0x18)) = 5;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar14 + -0x18)) = 9;
    poVar7 = std::ostream::_M_insert<double>
                       ((double)(local_294 /
                                (float)(ulong)(((long)local_218.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_218.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                              -0x5555555555555555)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Predictions: cetoza-",0x14);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," versi-",7);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_27c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," virginica-",0xb);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"deltas: cetoza-",0xf);
    poVar7 = std::ostream::_M_insert<double>(local_290);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," versi-",7);
    poVar7 = std::ostream::_M_insert<double>(local_288);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," virginica-",0xb);
    poVar7 = std::ostream::_M_insert<double>(local_258);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Accuracy: ",10);
    poVar7 = std::ostream::_M_insert<double>
                       ((double)(local_298 /
                                (float)(ulong)(((long)local_218.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_218.xTrain.
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                              -0x5555555555555555)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Silent samples: ",0x10);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," | ",3);
    IDenseNetwork::GetStringStats_abi_cxx11_(&local_278,pIVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_278._M_dataplus._M_p,local_278._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    IDenseNetwork::ResetStats(pIVar5);
    uVar4 = (int)local_250 + 1;
    local_250 = (ulong)uVar4;
  } while (uVar4 != 100);
  ppIVar1 = (pIVar5->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar1 != (pointer)0x0) {
    operator_delete(ppIVar1,(long)(pIVar5->layers).
                                  super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppIVar1);
  }
  operator_delete(pIVar5,0x30);
  if (local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.yTest.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector(&local_218.xTest);
  if (local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.yTrain.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
  ::~vector(&local_218.xTrain);
  if (ppfStack_120 != (pointer *)0x0) {
    operator_delete(ppfStack_120,(long)apfStack_110[0] - (long)ppfStack_120);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_138);
  if ((void *)aStack_150._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)aStack_150._M_allocated_capacity,(long)pfStack_140 - aStack_150._0_8_);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_168);
  std::vector<LayerMeta,_std::allocator<LayerMeta>_>::~vector
            ((vector<LayerMeta,_std::allocator<LayerMeta>_> *)(local_188 + 8));
  local_68 = std::__detail::_Prime_rehash_policy::_M_need_rehash;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<SPIKING_NN::EventKey,_SPIKING_NN::EventValue,_std::less<SPIKING_NN::EventKey>,_std::allocator<std::pair<const_SPIKING_NN::EventKey,_SPIKING_NN::EventValue>_>_>_>_>_>
  ::~_Rb_tree(local_60);
  return;
}

Assistant:

void DemoScripts::TrainSpikingIris( char *path, std::default_random_engine &generator )
{
    float EPS = 1e-1;
    float LEARNING_RATE_V = 0.000001;
    float LEARNING_RATE_W = 0.00001;
    float SIMULATION_TIME = 200;

    size_t IRIS_INPUT = 4;
    size_t IRIS_OUTPUT = 3;

    int BATCH_SIZE = 1;

    const float ALPHA = 0.05;
    const float BETA = 10;
    const float LAMBDA = 0.0001;


    std::vector<ILayer *> layers;
    LifSynapseBuilder synapseBuilder = LifSynapseBuilder( generator );
    LifNeuronBuilder neuronBuilder = LifNeuronBuilder();
    DenseLifLayerBuilder layerBuilder = DenseLifLayerBuilder();
    PreciseEventManager eventManager = PreciseEventManager();


    std::vector<LayerMeta> layersMeta = {
            {1,   "input",   IRIS_INPUT,  neuronBuilder, 1,   0},
            {1,   "hidden2", 6,           neuronBuilder, 2,   1},
            {0.5, "output",  IRIS_OUTPUT, neuronBuilder, 0.5, 1}
    };

    auto network = IDenseNetworkBuilder().Build( layersMeta, synapseBuilder, layerBuilder, eventManager,
                                                 generator, 0 );

    SPIKING_NN::Dataset rawData;
    SPIKING_NN::SpikeTrainDataset data;
    IRIS::ReadIris( path, rawData, 0 );
    DATA_CONVERSION::ConvertDataToSpikeTrains( rawData, data, generator, SIMULATION_TIME );

    for ( int epochId = 0; epochId < 100; epochId++ ) {
        float totalLoss = 0.f;
        int silentSamples = 0;
        int guesses = 0;
        int cetozaCnt = 0;
        int versiCnt = 0;
        int virginicaCnt = 0;
        float cetozaDelta = 0;
        float versiDelta = 0;
        float viriginicaDelta = 0;

        for ( int sampleId = 0; sampleId < data.xTrain.size(); sampleId++ ) {
            std::vector<float> output = network->Forward( data.xTrain[sampleId], SIMULATION_TIME, false );

            std::vector<float> deltas;
            float loss = NormedCustomLoss2( network->GetOutputNeurons(), data.yTrain[sampleId], deltas );
            totalLoss += loss;
            int predictedClassId = GetClassPrediction( output );
            silentSamples += predictedClassId == -1 ? 1 : 0;
            cetozaCnt += predictedClassId == 0 ? 1 : 0;
            versiCnt += predictedClassId == 1 ? 1 : 0;
            virginicaCnt += predictedClassId == 2 ? 1 : 0;
            int guess = abs((float) predictedClassId - data.yTrain[sampleId] ) < EPS;
            guesses += guess;
            cetozaDelta += abs( deltas[0] );
            versiDelta += abs( deltas[1] );
            viriginicaDelta += abs( deltas[2] );

            network->Backward( deltas );

            if (( sampleId + 1 ) % BATCH_SIZE == 0 ) {
                network->GradStep( BATCH_SIZE, LEARNING_RATE_V, LEARNING_RATE_W, BETA, LAMBDA );
            }
            network->Reset();
        }
        std::cout << "Loss for epoch: " << std::setw( 3 ) << epochId << " is: ";
        std::cout << std::fixed << std::setprecision( 5 ) << std::setw( 9 ) << totalLoss / data.xTrain.size() << " ";
        std::cout << "Predictions: cetoza-" << cetozaCnt << " versi-" << versiCnt << " virginica-" << virginicaCnt
                  << " ";
        std::cout << "deltas: cetoza-" << cetozaDelta << " versi-" << versiDelta << " virginica-" << viriginicaDelta
                  << " ";
        std::cout << "Accuracy: " << (float) guesses / data.xTrain.size() << " ";
        std::cout << "Silent samples: " << std::setw( 3 ) << silentSamples << " | ";
        std::cout << network->GetStringStats();
        network->ResetStats();
    }
    delete network;
}